

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O1

int utfchar(lua_State *L)

{
  int iVar1;
  int arg;
  bool bVar2;
  luaL_Buffer b;
  luaL_Buffer local_440;
  
  iVar1 = lua_gettop(L);
  if (iVar1 == 1) {
    pushutfchar(L,1);
  }
  else {
    luaL_buffinit(L,&local_440);
    if (0 < iVar1) {
      arg = 1;
      do {
        pushutfchar(L,arg);
        luaL_addvalue(&local_440);
        bVar2 = arg != iVar1;
        arg = arg + 1;
      } while (bVar2);
    }
    luaL_pushresult(&local_440);
  }
  return 1;
}

Assistant:

static int utfchar (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  if (n == 1)  /* optimize common case of single char */
    pushutfchar(L, 1);
  else {
    int i;
    luaL_Buffer b;
    luaL_buffinit(L, &b);
    for (i = 1; i <= n; i++) {
      pushutfchar(L, i);
      luaL_addvalue(&b);
    }
    luaL_pushresult(&b);
  }
  return 1;
}